

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wast-parser.cc
# Opt level: O2

Result __thiscall
wabt::WastParser::ParseScript
          (WastParser *this,unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_> *out_script
          )

{
  vector<wabt::Error,std::allocator<wabt::Error>> *this_00;
  __single_object __p;
  bool bVar1;
  Result RVar2;
  TokenType TVar3;
  TokenTypePair TVar4;
  Enum EVar5;
  long lVar6;
  allocator<char> local_92;
  allocator<char> local_91;
  __single_object script;
  _Head_base<0UL,_wabt::ModuleCommand_*,_false> local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  Location local_70;
  string local_50 [32];
  
  std::make_unique<wabt::Script>();
  TVar4 = PeekPair(this);
  bVar1 = anon_unknown_1::IsModuleField(TVar4);
  EVar5 = Error;
  if ((bVar1) || (bVar1 = PeekIsCustom(this), bVar1)) {
    std::make_unique<wabt::ModuleCommand>();
    GetLocation(&local_70,this);
    ((local_88._M_head_impl)->module).loc.field_1.field_1.offset =
         (size_t)local_70.field_1.field_1.offset;
    *(undefined8 *)((long)&((local_88._M_head_impl)->module).loc.field_1 + 8) =
         local_70.field_1._8_8_;
    ((local_88._M_head_impl)->module).loc.filename._M_len = local_70.filename._M_len;
    ((local_88._M_head_impl)->module).loc.filename._M_str = local_70.filename._M_str;
    RVar2 = ParseModuleFieldList(this,&(local_88._M_head_impl)->module);
    if (RVar2.enum_ != Error) {
      std::
      vector<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>,std::allocator<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>>>
      ::emplace_back<std::unique_ptr<wabt::ModuleCommand,std::default_delete<wabt::ModuleCommand>>>
                ((vector<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>,std::allocator<std::unique_ptr<wabt::Command,std::default_delete<wabt::Command>>>>
                  *)script._M_t.
                    super___uniq_ptr_impl<wabt::Script,_std::default_delete<wabt::Script>_>._M_t.
                    super__Tuple_impl<0UL,_wabt::Script_*,_std::default_delete<wabt::Script>_>.
                    super__Head_base<0UL,_wabt::Script_*,_false>._M_head_impl,
                 (unique_ptr<wabt::ModuleCommand,_std::default_delete<wabt::ModuleCommand>_> *)
                 &local_88);
    }
    if (local_88._M_head_impl != (ModuleCommand *)0x0) {
      (*((local_88._M_head_impl)->super_CommandMixin<(wabt::CommandType)0>).super_Command.
        _vptr_Command[1])();
    }
joined_r0x00153cb9:
    if (RVar2.enum_ == Error) goto LAB_00153cbb;
  }
  else {
    TVar4 = PeekPair(this);
    if (((TVar4._M_elems[0] == Lpar) && (TVar4._M_elems[1] < Result)) &&
       ((0x421190003f8U >> ((ulong)TVar4._M_elems >> 0x20 & 0x3f) & 1) != 0)) {
      RVar2 = ParseCommandList(this,(Script *)
                                    script._M_t.
                                    super___uniq_ptr_impl<wabt::Script,_std::default_delete<wabt::Script>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_wabt::Script_*,_std::default_delete<wabt::Script>_>
                                    .super__Head_base<0UL,_wabt::Script_*,_false>._M_head_impl,
                               (CommandPtrVector *)
                               script._M_t.
                               super___uniq_ptr_impl<wabt::Script,_std::default_delete<wabt::Script>_>
                               ._M_t.
                               super__Tuple_impl<0UL,_wabt::Script_*,_std::default_delete<wabt::Script>_>
                               .super__Head_base<0UL,_wabt::Script_*,_false>._M_head_impl);
      goto joined_r0x00153cb9;
    }
    TVar3 = Peek(this,0);
    if (TVar3 == Eof) {
      this_00 = (vector<wabt::Error,std::allocator<wabt::Error>> *)this->errors_;
      local_88._M_head_impl = local_88._M_head_impl & 0xffffffff00000000;
      GetLocation(&local_70,this);
      std::vector<wabt::Error,std::allocator<wabt::Error>>::
      emplace_back<wabt::ErrorLevel,wabt::Location,char_const(&)[13]>
                (this_00,(ErrorLevel *)&local_88,&local_70,(char (*) [13])"empty script");
    }
    else {
      ConsumeIfLpar(this);
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_70,"a module field",&local_91);
      std::__cxx11::string::string<std::allocator<char>>(local_50,"a command",&local_92);
      local_88._M_head_impl = (ModuleCommand *)0x0;
      uStack_80 = 0;
      local_78 = 0;
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      _M_range_initialize<std::__cxx11::string_const*>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_88,
                 &local_70,&stack0xffffffffffffffd0);
      ErrorExpected(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)&local_88,(char *)0x0);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)&local_88);
      lVar6 = 0x20;
      do {
        std::__cxx11::string::_M_dispose();
        lVar6 = lVar6 + -0x20;
      } while (lVar6 != -0x20);
    }
  }
  RVar2 = Expect(this,Eof);
  if ((RVar2.enum_ != Error) && (bVar1 = HasError(this), __p = script, !bVar1)) {
    script._M_t.super___uniq_ptr_impl<wabt::Script,_std::default_delete<wabt::Script>_>._M_t.
    super__Tuple_impl<0UL,_wabt::Script_*,_std::default_delete<wabt::Script>_>.
    super__Head_base<0UL,_wabt::Script_*,_false>._M_head_impl =
         (__uniq_ptr_data<wabt::Script,_std::default_delete<wabt::Script>,_true,_true>)
         (__uniq_ptr_impl<wabt::Script,_std::default_delete<wabt::Script>_>)0x0;
    std::__uniq_ptr_impl<wabt::Script,_std::default_delete<wabt::Script>_>::reset
              ((__uniq_ptr_impl<wabt::Script,_std::default_delete<wabt::Script>_> *)out_script,
               (pointer)__p._M_t.
                        super___uniq_ptr_impl<wabt::Script,_std::default_delete<wabt::Script>_>._M_t
                        .super__Tuple_impl<0UL,_wabt::Script_*,_std::default_delete<wabt::Script>_>.
                        super__Head_base<0UL,_wabt::Script_*,_false>._M_head_impl);
    EVar5 = Ok;
  }
LAB_00153cbb:
  std::unique_ptr<wabt::Script,_std::default_delete<wabt::Script>_>::~unique_ptr(&script);
  return (Result)EVar5;
}

Assistant:

Result WastParser::ParseScript(std::unique_ptr<Script>* out_script) {
  WABT_TRACE(ParseScript);
  auto script = std::make_unique<Script>();

  // Don't consume the Lpar yet, even though it is required. This way the
  // sub-parser functions (e.g. ParseFuncModuleField) can consume it and keep
  // the parsing structure more regular.
  if (IsModuleField(PeekPair()) || PeekIsCustom()) {
    // Parse an inline module (i.e. one with no surrounding (module)).
    auto command = std::make_unique<ModuleCommand>();
    command->module.loc = GetLocation();
    CHECK_RESULT(ParseModuleFieldList(&command->module));
    script->commands.emplace_back(std::move(command));
  } else if (IsCommand(PeekPair())) {
    CHECK_RESULT(ParseCommandList(script.get(), &script->commands));
  } else if (PeekMatch(TokenType::Eof)) {
    errors_->emplace_back(ErrorLevel::Warning, GetLocation(), "empty script");
  } else {
    ConsumeIfLpar();
    ErrorExpected({"a module field", "a command"});
  }

  EXPECT(Eof);
  if (!HasError()) {
    *out_script = std::move(script);
    return Result::Ok;
  } else {
    return Result::Error;
  }
}